

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

Am_Text_Style_Run * __thiscall
Am_Rich_Text_Data::Get_Style_Run_At(Am_Rich_Text_Data *this,Am_Text_Index inIndex)

{
  Am_Text_Style_Run *pAVar1;
  Am_Text_Style_Run **ppAVar2;
  ulong uVar3;
  
  ppAVar2 = &this->mHeadStyle;
  uVar3 = 0;
  while( true ) {
    pAVar1 = *ppAVar2;
    if ((pAVar1 == (Am_Text_Style_Run *)0x0) ||
       (uVar3 = uVar3 + pAVar1->mCharsInRun, inIndex <= uVar3)) break;
    ppAVar2 = &pAVar1->mNext;
  }
  return pAVar1;
}

Assistant:

Am_Text_Style_Run *
Am_Rich_Text_Data::Get_Style_Run_At(const Am_Text_Index inIndex) const
{
  Am_Text_Index endOfRun = 0;
  Am_Text_Style_Run *sr = mHeadStyle;

  while (sr != nullptr) {
    endOfRun += sr->Length();
    if (inIndex <= endOfRun)
      break;
    sr = sr->Next();
  }
  return sr;
}